

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O0

void check_tris(tri_cc_t *te)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  uint *puVar8;
  ostream *poVar9;
  void *this;
  runtime_error *this_00;
  string local_1f8 [32];
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [376];
  int local_50;
  uint local_4c;
  int t_no;
  int t;
  int tstart;
  int i_1;
  int i;
  allocator<int> local_2d;
  value_type_conflict2 local_2c;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> vert_tri_ct;
  tri_cc_t *te_local;
  
  vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)te;
  iVar2 = tri_cc_t::vert_ct(te);
  local_2c = 0;
  std::allocator<int>::allocator(&local_2d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,(long)iVar2,&local_2c,&local_2d);
  std::allocator<int>::~allocator(&local_2d);
  for (tstart = 0; uVar4 = (ulong)tstart,
      sVar5 = std::vector<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>::size
                        ((vector<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_> *)
                         vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), uVar4 < sVar5;
      tstart = tstart + 1) {
    pvVar6 = std::vector<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>::operator[]
                       ((vector<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_> *)
                        vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(long)tstart);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(ulong)pvVar6->v);
    *pvVar7 = *pvVar7 + 1;
  }
  t = 0;
  do {
    iVar2 = t;
    iVar3 = tri_cc_t::vert_ct((tri_cc_t *)
                              vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
    if (iVar3 <= iVar2) {
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28)
      ;
      return;
    }
    puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 6),(long)t);
    local_4c = *puVar8;
    local_50 = 0;
    t_no = local_4c;
    do {
      local_50 = local_50 + 1;
      local_4c = eprev(local_4c);
      bVar1 = tri_cc_t::has_fnext((tri_cc_t *)
                                  vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,local_4c);
      if (!bVar1) break;
      local_4c = tri_cc_t::fnext((tri_cc_t *)
                                 vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,local_4c);
    } while (local_4c != t_no);
    iVar2 = local_50;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)t);
    if (iVar2 != *pvVar7) {
      std::__cxx11::stringstream::stringstream(local_1d8);
      poVar9 = std::operator<<(local_1c8,"Failed to ensure condition ");
      poVar9 = std::operator<<(poVar9,"t_no == vert_tri_ct[i]");
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"at (");
      poVar9 = std::operator<<(poVar9,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                              );
      poVar9 = std::operator<<(poVar9,",");
      poVar9 = std::operator<<(poVar9,"check_tris");
      poVar9 = std::operator<<(poVar9,",");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x2c9);
      poVar9 = std::operator<<(poVar9,") \n ");
      poVar9 = std::operator<<(poVar9,"Non manifold vertex found");
      poVar9 = std::operator<<(poVar9,"i");
      poVar9 = std::operator<<(poVar9," = ");
      this = (void *)std::ostream::operator<<(poVar9,t);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_00,local_1f8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    t = t + 1;
  } while( true );
}

Assistant:

void check_tris(const tri_cc_t &te)
{
  vector<int> vert_tri_ct(te.vert_ct(),0);

  for( int i = 0 ; i < te.m_tris.size(); ++i)
  {
    vert_tri_ct[te.m_tris[i].v]++;
  }

  for( int i = 0 ; i < te.vert_ct(); ++i)
  {
    int tstart = te.m_verts[i],t = tstart,t_no = 0;

    do
    {
      t_no++;
      t = eprev(t);
      if (!te.has_fnext(t)) break;
      t = te.fnext(t);
    } while(t != tstart);

    ENSURES(t_no == vert_tri_ct[i])
        << "Non manifold vertex found"
        << STRMVAR(i)
        << endl;
  }
}